

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O2

TPZAutoPointer<TPZMatrix<double>_>
TPZAutoPointerDynamicCast<TPZMatrix<double>,TPZBaseMatrix>(TPZAutoPointer<TPZBaseMatrix> *in)

{
  atomic_int *paVar1;
  TPZReference *pTVar2;
  long lVar3;
  long *in_RSI;
  
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer((TPZAutoPointer<TPZMatrix<double>_> *)in);
  if (*(long *)*in_RSI != 0) {
    lVar3 = __dynamic_cast(*(long *)*in_RSI,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo,0)
    ;
    if (lVar3 != 0) {
      pTVar2 = in->fRef;
      if (pTVar2 != (TPZReference *)0x0) {
        TPZAutoPointer<TPZMatrix<double>_>::TPZReference::~TPZReference((TPZReference *)pTVar2);
      }
      operator_delete(pTVar2,0x10);
      pTVar2 = (TPZReference *)*in_RSI;
      in->fRef = pTVar2;
      LOCK();
      paVar1 = &pTVar2->fCounter;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
    }
  }
  return (TPZAutoPointer<TPZMatrix<double>_>)(TPZReference *)in;
}

Assistant:

TPZAutoPointer<R> TPZAutoPointerDynamicCast(TPZAutoPointer<T> in) {
    TPZAutoPointer<R> rv;
    if (R* p; (p = dynamic_cast<R*> (in.fRef->fPointer)) ) {
        delete rv.fRef;
        rv.fRef = (typename TPZAutoPointer<R>::TPZReference *) in.fRef;
        rv.fRef->Increment();
    }
    return rv;
}